

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int IFN_End_Of_Line(FORM *form)

{
  FIELD *pFVar1;
  char *buf;
  char *bp;
  char *pos;
  FIELD *field;
  FORM *form_local;
  
  pFVar1 = form->current;
  Synchronize_Buffer(form);
  buf = form->current->buf + form->currow * form->current->dcols;
  bp = After_End_Of_Data(buf,pFVar1->dcols);
  if (bp == buf + pFVar1->dcols) {
    bp = bp + -1;
  }
  Adjust_Cursor_Position(form,bp);
  return 0;
}

Assistant:

static int IFN_End_Of_Line(FORM * form)
{
  FIELD *field = form->current;
  char *pos;
  char *bp;

  Synchronize_Buffer(form);
  bp  = Address_Of_Current_Row_In_Buffer(form); 
  pos = After_End_Of_Data(bp,field->dcols);
  if (pos == (bp + field->dcols))
    pos--;
  Adjust_Cursor_Position(form,pos);
  return(E_OK);
}